

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O3

void xercesc_4_0::XMLString::removeChar(XMLCh *srcString,XMLCh *toRemove,XMLBuffer *dstBuffer)

{
  XMLSize_t XVar1;
  XMLSize_t XVar2;
  XMLCh XVar3;
  XMLCh *pXVar4;
  
  if (srcString != (XMLCh *)0x0) {
    dstBuffer->fIndex = 0;
    XVar3 = *srcString;
    if (XVar3 != L'\0') {
      pXVar4 = srcString + 1;
      XVar1 = 0;
      do {
        if (XVar3 != *toRemove) {
          XVar2 = XVar1;
          if (XVar1 == dstBuffer->fCapacity) {
            XMLBuffer::ensureCapacity(dstBuffer,1);
            XVar2 = dstBuffer->fIndex;
          }
          XVar1 = XVar2 + 1;
          dstBuffer->fIndex = XVar1;
          dstBuffer->fBuffer[XVar2] = XVar3;
        }
        XVar3 = *pXVar4;
        pXVar4 = pXVar4 + 1;
      } while (XVar3 != L'\0');
    }
  }
  return;
}

Assistant:

void XMLString::removeChar(const XMLCh*     const srcString
                         , const XMLCh&           toRemove
                         ,       XMLBuffer&       dstBuffer)
{
    if(!srcString) return;
    const XMLCh* pszSrc = srcString;
    XMLCh c;

    dstBuffer.reset();

    while ((c=*pszSrc++)!=0)
    {
        if (c != toRemove)
            dstBuffer.append(c);
    }
}